

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O1

void * handle_client(void *arg)

{
  int socket;
  bool bVar1;
  player_modes pVar2;
  int iVar3;
  ulong uVar4;
  ssize_t sVar5;
  ostream *poVar6;
  char *pcVar7;
  size_t sVar8;
  long *plVar9;
  byte bVar10;
  _List_node_base *p_Var11;
  _Alloc_hider _Var12;
  ulong uVar13;
  bool client_connected;
  char temp;
  int col;
  int row;
  Player player;
  StatusCode status;
  char buffer [512];
  bool local_33a;
  char local_339;
  Player local_338;
  int local_308;
  int local_304;
  Player local_300;
  Player local_2d0;
  StatusCode local_29c;
  Player local_298;
  Player local_268;
  char local_238 [520];
  
  socket = *arg;
  local_33a = true;
  local_339 = '\0';
  local_304 = 0;
  local_308 = 0;
  Player::Player(&local_2d0,socket);
  if (local_33a == true) {
    do {
      pVar2 = Player::GetMode(&local_2d0);
      if (pVar2 == COMMAND) {
        uVar4 = 0;
        bVar10 = local_33a;
        if (local_339 != '\n') {
          uVar13 = 0;
          while ((bVar10 & 1) != 0) {
            sVar5 = read(socket,&local_339,1);
            if (sVar5 == 0) {
              bVar10 = 0;
            }
            else {
              local_238[uVar13] = local_339;
            }
            uVar4 = uVar13 + 1;
            if ((0x1fd < uVar13) || (uVar13 = uVar4, local_339 == '\n')) goto LAB_00103bd4;
          }
          uVar4 = uVar13 & 0xffffffff;
        }
LAB_00103bd4:
        local_339 = '\0';
        local_238[uVar4 & 0xffffffff] = '\0';
        local_238[(long)(int)uVar4 + -1] = '\0';
        local_33a = (bool)bVar10;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Received command \"",0x12);
        sVar8 = strlen(local_238);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_238,sVar8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" from ",7);
        Player::GetName_abi_cxx11_((string *)&local_338,&local_2d0);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)local_338._0_8_,
                            (long)local_338.m_name._M_dataplus._M_p);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
        if ((char *)local_338._0_8_ != (char *)((long)&local_338 + 0x10U)) {
          operator_delete((void *)local_338._0_8_);
        }
        local_238[(long)(int)uVar4 + -1] = '\n';
        bVar1 = ProcessCommand(local_238,&local_2d0,&local_33a);
        if (!bVar1) {
          iVar3 = Player::GetSocket(&local_2d0);
          SendStatus(iVar3,INVALID_CMD);
        }
      }
      else {
        pVar2 = Player::GetMode(&local_2d0);
        if (pVar2 == INGAME) {
          pthread_mutex_lock((pthread_mutex_t *)&games_lock);
          p_Var11 = game_list_abi_cxx11_.super__List_base<TTTGame_*,_std::allocator<TTTGame_*>_>.
                    _M_impl._M_node.super__List_node_base._M_next;
          Player::Player(&local_268,&local_2d0);
          Player::Player(&local_298,&local_268);
          Player::Player(&local_338,&local_298);
          Player::Player(&local_300,&local_338);
          if (local_338.m_name._M_dataplus._M_p != (pointer)((long)&local_338 + 0x18U)) {
            operator_delete(local_338.m_name._M_dataplus._M_p);
          }
          Player::Player(&local_338,&local_300);
          while ((p_Var11 != (_List_node_base *)&game_list_abi_cxx11_ &&
                 (bVar1 = TTTGame::HasPlayer((TTTGame *)p_Var11[1]._M_next,&local_338), !bVar1))) {
            p_Var11 = (((_List_base<TTTGame_*,_std::allocator<TTTGame_*>_> *)&p_Var11->_M_next)->
                      _M_impl)._M_node.super__List_node_base._M_next;
          }
          if (local_338.m_name._M_dataplus._M_p != (pointer)((long)&local_338 + 0x18U)) {
            operator_delete(local_338.m_name._M_dataplus._M_p);
          }
          if (local_300.m_name._M_dataplus._M_p != (pointer)((long)&local_300 + 0x18U)) {
            operator_delete(local_300.m_name._M_dataplus._M_p);
          }
          if (local_298.m_name._M_dataplus._M_p != (pointer)((long)&local_298 + 0x18U)) {
            operator_delete(local_298.m_name._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_268.m_name._M_dataplus._M_p != &local_268.m_name.field_2) {
            operator_delete(local_268.m_name._M_dataplus._M_p);
          }
          pthread_mutex_unlock((pthread_mutex_t *)&games_lock);
          if (p_Var11 == (_List_node_base *)&game_list_abi_cxx11_) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Somehow Player ",0xf);
            Player::GetName_abi_cxx11_((string *)&local_338,&local_2d0);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,(char *)local_338._0_8_,
                                (long)local_338.m_name._M_dataplus._M_p);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar6," isn\'t a part of a game but is INGAME",0x25);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
            std::ostream::put((char)poVar6);
            std::ostream::flush();
            pcVar7 = (char *)((long)&local_338 + 0x10);
            _Var12._M_p = (pointer)local_338._0_8_;
LAB_00103bbe:
            if (_Var12._M_p != pcVar7) {
              operator_delete(_Var12._M_p);
            }
          }
          else {
            iVar3 = Player::GetSocket(&local_2d0);
            local_33a = ReceiveStatus(iVar3,&local_29c);
            if (local_33a) {
              if (local_29c == MOVE) {
                iVar3 = Player::GetSocket(&local_2d0);
                ReceiveInt(iVar3,&local_304);
                iVar3 = Player::GetSocket(&local_2d0);
                ReceiveInt(iVar3,&local_308);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"Received moved from ",0x14);
                Player::GetName_abi_cxx11_((string *)&local_338,&local_2d0);
                poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)&std::cout,(char *)local_338._0_8_,
                                    (long)local_338.m_name._M_dataplus._M_p);
                std::__ostream_insert<char,std::char_traits<char>>(poVar6,": row=",6);
                poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,local_304);
                std::__ostream_insert<char,std::char_traits<char>>(poVar6,", col=",6);
                plVar9 = (long *)std::ostream::operator<<((ostream *)poVar6,local_308);
                std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
                std::ostream::put((char)plVar9);
                std::ostream::flush();
                if ((char *)local_338._0_8_ != (char *)((long)&local_338 + 0x10U)) {
                  operator_delete((void *)local_338._0_8_);
                }
                TTTGame::GetOtherPlayer(&local_338,(TTTGame *)p_Var11[1]._M_next,&local_2d0);
                iVar3 = Player::GetSocket(&local_338);
                SendStatus(iVar3,MOVE);
                if (local_338.m_name._M_dataplus._M_p != (pointer)((long)&local_338 + 0x18U)) {
                  operator_delete(local_338.m_name._M_dataplus._M_p);
                }
                TTTGame::GetOtherPlayer(&local_338,(TTTGame *)p_Var11[1]._M_next,&local_2d0);
                iVar3 = Player::GetSocket(&local_338);
                SendInt(iVar3,local_304);
                if (local_338.m_name._M_dataplus._M_p != (pointer)((long)&local_338 + 0x18U)) {
                  operator_delete(local_338.m_name._M_dataplus._M_p);
                }
                TTTGame::GetOtherPlayer(&local_338,(TTTGame *)p_Var11[1]._M_next,&local_2d0);
                iVar3 = Player::GetSocket(&local_338);
                local_33a = SendInt(iVar3,local_308);
                if (local_338.m_name._M_dataplus._M_p != (pointer)((long)&local_338 + 0x18U)) {
                  operator_delete(local_338.m_name._M_dataplus._M_p);
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"Sent move to ",0xd);
                TTTGame::GetOtherPlayer(&local_338,(TTTGame *)p_Var11[1]._M_next,&local_2d0);
                Player::GetName_abi_cxx11_((string *)&local_300,&local_338);
                poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)&std::cout,(char *)local_300._0_8_,
                                    (long)local_300.m_name._M_dataplus._M_p);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
                std::ostream::put((char)poVar6);
                std::ostream::flush();
                if ((char *)local_300._0_8_ != (char *)((long)&local_300 + 0x10U)) {
                  operator_delete((void *)local_300._0_8_);
                }
                pcVar7 = (char *)((long)&local_338 + 0x18);
                _Var12._M_p = local_338.m_name._M_dataplus._M_p;
                goto LAB_00103bbe;
              }
              if (local_29c == WIN) {
                Player::GetName_abi_cxx11_((string *)&local_300,&local_2d0);
                poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)&std::cout,(char *)local_300._0_8_,
                                    (long)local_300.m_name._M_dataplus._M_p);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar6," won a game against ",0x14);
                TTTGame::GetOtherPlayer(&local_338,(TTTGame *)p_Var11[1]._M_next,&local_2d0);
                Player::GetName_abi_cxx11_((string *)&local_298,&local_338);
                poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                   (poVar6,(char *)local_298._0_8_,
                                    (long)local_298.m_name._M_dataplus._M_p);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
                std::ostream::put((char)poVar6);
                std::ostream::flush();
              }
              else {
                if (local_29c != DRAW) {
                  iVar3 = Player::GetSocket(&local_2d0);
                  local_33a = SendStatus(iVar3,INVALID_CMD);
                  goto LAB_0010401c;
                }
                Player::GetName_abi_cxx11_((string *)&local_300,&local_2d0);
                poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)&std::cout,(char *)local_300._0_8_,
                                    (long)local_300.m_name._M_dataplus._M_p);
                std::__ostream_insert<char,std::char_traits<char>>(poVar6," tied against ",0xe);
                TTTGame::GetOtherPlayer(&local_338,(TTTGame *)p_Var11[1]._M_next,&local_2d0);
                Player::GetName_abi_cxx11_((string *)&local_298,&local_338);
                poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                   (poVar6,(char *)local_298._0_8_,
                                    (long)local_298.m_name._M_dataplus._M_p);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
                std::ostream::put((char)poVar6);
                std::ostream::flush();
              }
              if ((char *)local_298._0_8_ != (char *)((long)&local_298 + 0x10U)) {
                operator_delete((void *)local_298._0_8_);
              }
              if (local_338.m_name._M_dataplus._M_p != (pointer)((long)&local_338 + 0x18U)) {
                operator_delete(local_338.m_name._M_dataplus._M_p);
              }
              if ((char *)local_300._0_8_ != (char *)((long)&local_300 + 0x10U)) {
                operator_delete((void *)local_300._0_8_);
              }
              local_33a = false;
            }
          }
        }
      }
LAB_0010401c:
    } while (local_33a != false);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Player \"",8);
  Player::GetName_abi_cxx11_((string *)&local_338,&local_2d0);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_338._0_8_,
                      (long)local_338.m_name._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\" has disconnected",0x12);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  if ((char *)local_338._0_8_ != (char *)((long)&local_338 + 0x10U)) {
    operator_delete((void *)local_338._0_8_);
  }
  DisconnectPlayer(&local_2d0);
  close(socket);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0.m_name._M_dataplus._M_p != &local_2d0.m_name.field_2) {
    operator_delete(local_2d0.m_name._M_dataplus._M_p);
  }
  return (void *)0x0;
}

Assistant:

void * handle_client(void * arg)
{
    int client_sock = *(int *)arg;
    char buffer[BUF_SIZE];
    bool client_connected = true;
    char temp = '\0';
    int row = 0, col = 0;
    int i = 0;

    // Create the player
    Player player(client_sock);

    // Always handle the client
    while(client_connected)
    {
        // Process commands or pass game data
        if(player.GetMode() == COMMAND)
        {
            // Read a line of text or until the buffer is full
            for(i = 0; (i < (BUF_SIZE - 1)) && temp != '\n' && client_connected; ++i)
            {
                // Receive a single character and make sure the client is still connected
                if(read(client_sock, &temp, 1) == 0)
                    client_connected = false;
                else
                    buffer[i] = temp;
            }

            // Reset temp so we don't get an infinite loop
            temp = '\0';
            buffer[i] = '\0';
            buffer[i - 1] = '\0';
            cout << "Received command \"" << buffer << "\" from " << player.GetName() << endl;
            buffer[i - 1] = '\n';

            // If there's an invalid command, tell the client
            if(!ProcessCommand(buffer, player, client_connected))
                SendStatus(player.GetSocket(), INVALID_CMD);
        }
        else if (player.GetMode() == INGAME)
        {
            // Get the game the player is a part of
            pthread_mutex_lock(&games_lock);
            auto game = find_if(game_list.begin(), game_list.end(),
                      [player] (TTTGame * game) { return game->HasPlayer(player); });
            auto end = game_list.end();
            pthread_mutex_unlock(&games_lock);

            // Something horrible has gone wrong
            if(game == end)
                cout << "Somehow Player " << player.GetName() << " isn't a part of a game but is INGAME" << endl;
            else
            {
                StatusCode status;
                client_connected = ReceiveStatus(player.GetSocket(), &status);

                // If the player is still connected, then perform the move
                if(client_connected)
                {
                    switch(status)
                    {
                        case MOVE:
                            // Pass the row and column right along
                            ReceiveInt(player.GetSocket(), &row);
                            ReceiveInt(player.GetSocket(), &col);
                            cout << "Received moved from " << player.GetName()
                                 << ": row=" << row << ", col=" << col << endl;

                            SendStatus((*game)->GetOtherPlayer(player).GetSocket(), MOVE);
                            SendInt((*game)->GetOtherPlayer(player).GetSocket(), row);
                            client_connected = SendInt((*game)->GetOtherPlayer(player).GetSocket(), col);
                            cout << "Sent move to " << (*game)->GetOtherPlayer(player).GetName() << endl;

                            break;
                        case WIN:
                            cout << player.GetName() << " won a game against " << (*game)->GetOtherPlayer(player).GetName() << endl;
                            client_connected = false;
                            break;
                        case DRAW:
                            cout << player.GetName() << " tied against " << (*game)->GetOtherPlayer(player).GetName() << endl;
                            client_connected = false;
                            break;
                        default:
                            client_connected = SendStatus(player.GetSocket(), INVALID_CMD);
                    }
                }
            }
        }
    }

    // The client disconnected on us D:
    cout << "Player \"" << player.GetName() << "\" has disconnected" << endl;
    DisconnectPlayer(player);
    close(client_sock);

    return (void *)0;
}